

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocations.cpp
# Opt level: O2

void Allocations::collectAreaStats(AllocationStats *stats)

{
  long lVar1;
  _Base_ptr fileID;
  _Base_ptr position;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  undefined8 uVar4;
  _Base_ptr p_Var5;
  int64_t iVar6;
  _Base_ptr p_Var7;
  long lVar8;
  _Base_ptr local_70;
  _Base_ptr local_68;
  anon_class_8_1_a8a4b3bf applyUsage;
  Usage local_58;
  long local_38;
  
  local_58.space = 0;
  local_58.usage = 0;
  local_58.usesFill = false;
  local_58.shared = false;
  local_58._18_6_ = 0;
  p_Var5 = (_Base_ptr)0xffffffffffffffff;
  lVar8 = 0;
  local_68 = p_Var5;
  local_70 = p_Var5;
  applyUsage.stats = stats;
  for (p_Var7 = allocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &allocations._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    fileID = *(_Base_ptr *)(p_Var7 + 1);
    position = p_Var7[1]._M_parent;
    p_Var2 = p_Var7[1]._M_left;
    p_Var3 = p_Var7[1]._M_right;
    uVar4 = *(undefined8 *)(p_Var7 + 2);
    if (((fileID == local_68) && ((long)local_70 < (long)position)) &&
       ((long)position < (long)p_Var5)) {
      lVar1 = (long)&local_70->_M_color + lVar8;
      local_38 = lVar8;
      iVar6 = getSubAreaUsage((int64_t)local_68,(int64_t)position);
      if (lVar1 < (long)position) {
        iVar6 = getSubAreaUsage((int64_t)local_68,(int64_t)position);
        lVar8 = (long)&p_Var3->_M_color + iVar6;
      }
      else {
        lVar8 = (long)position + (long)&p_Var3->_M_color + (iVar6 - lVar1);
      }
      lVar8 = lVar8 + local_38;
      local_58.space = (long)position + ((long)&p_Var2->_M_color - (long)local_70);
    }
    else {
      if (local_70 != (_Base_ptr)0xffffffffffffffff) {
        collectAreaStats::anon_class_8_1_a8a4b3bf::operator()
                  (&applyUsage,(int64_t)local_70,&local_58);
      }
      local_58.space = (int64_t)p_Var2;
      local_58._16_8_ = uVar4;
      iVar6 = getSubAreaUsage((int64_t)fileID,(int64_t)position);
      lVar8 = (long)&p_Var3->_M_color + iVar6;
      local_70 = position;
      local_68 = fileID;
    }
    p_Var5 = (_Base_ptr)((long)&position->_M_color + (long)&p_Var2->_M_color);
    local_58.usage = lVar8;
  }
  if (local_70 != (_Base_ptr)0xffffffffffffffff) {
    collectAreaStats::anon_class_8_1_a8a4b3bf::operator()(&applyUsage,(int64_t)local_70,&local_58);
  }
  return;
}

Assistant:

void Allocations::collectAreaStats(AllocationStats &stats)
{
	// Need to work out overlaps.
	Key lastKey{ -1, -1 };
	int64_t lastEndPosition = -1;
	Usage lastUsage{};

	auto applyUsage = [&stats](int64_t position, const Usage &usage)
	{
		if (usage.space > stats.largestSize)
		{
			stats.largestPosition = position;
			stats.largestSize = usage.space;
			stats.largestUsage = usage.usage;
		}

		if (usage.space - usage.usage > stats.largestFreeSize - stats.largestFreeUsage)
		{
			stats.largestFreePosition = position;
			stats.largestFreeSize = usage.space;
			stats.largestFreeUsage = usage.usage;
		}

		// We assume overlaps agree on sharing, hopefully...
		if (usage.shared && usage.space - usage.usage > stats.sharedFreeSize - stats.sharedFreeUsage)
		{
			stats.sharedFreePosition = position;
			stats.sharedFreeSize = usage.space;
			stats.sharedFreeUsage = usage.usage;
		}

		stats.totalSize += usage.space;
		stats.totalUsage += usage.usage;
		if (usage.shared)
		{
			stats.sharedSize += usage.space;
			stats.sharedUsage += usage.usage;
		}
	};

	for (auto it : allocations)
	{
		if (it.first.fileID == lastKey.fileID && it.first.position > lastKey.position && it.first.position < lastEndPosition)
		{
			// Overlap, merge.
			int64_t lastUsageEnd = lastKey.position + lastUsage.usage;
			int64_t newUsageEnd = it.first.position + it.second.usage + getSubAreaUsage(it.first);

			if (lastUsageEnd >= it.first.position)
				lastUsage.usage += newUsageEnd - lastUsageEnd;
			else
				lastUsage.usage += it.second.usage + getSubAreaUsage(it.first);

			lastEndPosition = it.first.position + it.second.space;
			lastUsage.space = lastEndPosition - lastKey.position;

			continue;
		}

		if (lastKey.position != -1)
			applyUsage(lastKey.position, lastUsage);

		lastKey = it.first;
		lastUsage = it.second;
		lastUsage.usage += getSubAreaUsage(lastKey);
		lastEndPosition = it.first.position + it.second.space;
	}

	if (lastKey.position != -1)
		applyUsage(lastKey.position, lastUsage);
}